

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeakReferenceDictionary.h
# Opt level: O1

int __thiscall
JsUtil::
SplitWeakDictionary<int,Js::PropertyString*,false,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::NoResizeLock,Memory::Recycler>
::
Insert<(JsUtil::SplitWeakDictionary<int,Js::PropertyString*,false,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::NoResizeLock,Memory::Recycler>::InsertOperations)2>
          (SplitWeakDictionary<int,Js::PropertyString*,false,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::NoResizeLock,Memory::Recycler>
           *this,TBKey *key,TBValue *value)

{
  SplitWeakDictionary<int,Js::PropertyString*,false,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::NoResizeLock,Memory::Recycler>
  *pSVar1;
  int iVar2;
  int iVar3;
  code *pcVar4;
  bool bVar5;
  hash_t hVar6;
  undefined4 *puVar7;
  int iVar8;
  ulong in_RCX;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  uint local_38;
  
  lVar12 = *(long *)(this + 8);
  if (lVar12 == 0) {
    SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
    ::Initialize((SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                  *)this,0);
    lVar12 = *(long *)(this + 8);
  }
  local_38 = *key & 0x7fffffff;
  hVar6 = PrimePolicy::ModPrime(*key & 0x7fffffff,*(uint *)(this + 0x2c),*(int *)(this + 0x3c));
  lVar11 = *(long *)(this + 0x10);
  uVar10 = *(uint *)(lVar12 + (ulong)hVar6 * 4);
  do {
    iVar8 = (int)in_RCX;
    if ((int)uVar10 < 0) {
      bVar5 = false;
      break;
    }
    uVar9 = (ulong)uVar10;
    iVar2 = *(int *)(*(long *)(this + 0x10) + uVar9 * 8);
    iVar3 = *key;
    if (iVar2 != iVar3) {
      uVar10 = *(uint *)(lVar11 + 4 + uVar9 * 8);
    }
    else {
      Memory::RecyclerWeakReferenceRegionItem<Js::PropertyString_*>::operator=
                ((RecyclerWeakReferenceRegionItem<Js::PropertyString_*> *)
                 (uVar9 * 0x10 + *(long *)(this + 0x18)),*value);
      in_RCX = (ulong)uVar10;
    }
    iVar8 = (int)in_RCX;
    bVar5 = iVar2 == iVar3;
  } while (iVar2 != iVar3);
  if (!bVar5) {
    if ((*(int *)(this + 0x38) == 0) && (*(int *)(this + 0x30) == *(int *)(this + 0x28))) {
      (*(code *)**(undefined8 **)this)(this);
    }
    if (*(int *)(this + 0x38) == 0) {
      iVar8 = *(int *)(this + 0x30);
      if (iVar8 == *(int *)(this + 0x28)) {
        SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
        ::Resize((SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                  *)this);
        hVar6 = PrimePolicy::ModPrime(local_38,*(uint *)(this + 0x2c),*(int *)(this + 0x3c));
        iVar8 = *(int *)(this + 0x30);
      }
      *(int *)(this + 0x30) = iVar8 + 1;
      if (*(int *)(this + 0x28) < iVar8 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                           ,0x2ba,"(count <= size)","count <= size");
        if (!bVar5) goto LAB_007a2fcb;
        *puVar7 = 0;
      }
      if (*(int *)(this + 0x28) <= iVar8) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                           ,699,"(index < size)","index < size");
        if (!bVar5) goto LAB_007a2fcb;
        *puVar7 = 0;
      }
    }
    else {
      if (*(int *)(this + 0x38) < 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                           ,0x29d,"(freeCount > 0)","freeCount > 0");
        if (!bVar5) goto LAB_007a2fcb;
        *puVar7 = 0;
      }
      if (*(int *)(this + 0x34) < 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                           ,0x29e,"(freeList >= 0)","freeList >= 0");
        if (!bVar5) goto LAB_007a2fcb;
        *puVar7 = 0;
      }
      if (*(int *)(this + 0x30) <= *(int *)(this + 0x34)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                           ,0x29f,"(freeList < count)","freeList < count");
        if (!bVar5) goto LAB_007a2fcb;
        *puVar7 = 0;
      }
      iVar8 = *(int *)(this + 0x34);
      pSVar1 = this + 0x38;
      *(int *)pSVar1 = *(int *)pSVar1 + -1;
      if (*(int *)pSVar1 != 0) {
        lVar12 = *(long *)(this + 0x10);
        if (-2 < *(int *)(lVar12 + 4 + (long)iVar8 * 8)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                             ,0x1a9,"(IsFreeEntry(freeEntry))","IsFreeEntry(freeEntry)");
          if (!bVar5) {
LAB_007a2fcb:
            pcVar4 = (code *)invalidInstructionException();
            (*pcVar4)();
          }
          *puVar7 = 0;
        }
        *(int *)(this + 0x34) = -2 - *(int *)(lVar12 + 4 + (long)iVar8 * 8);
      }
    }
    lVar11 = (long)iVar8;
    *(TBKey *)(*(long *)(this + 0x10) + lVar11 * 8) = *key;
    Memory::RecyclerWeakReferenceRegionItem<Js::PropertyString_*>::operator=
              ((RecyclerWeakReferenceRegionItem<Js::PropertyString_*> *)
               (lVar11 * 0x10 + *(long *)(this + 0x18)),*value);
    lVar12 = *(long *)(this + 8);
    *(undefined4 *)(*(long *)(this + 0x10) + 4 + lVar11 * 8) =
         *(undefined4 *)(lVar12 + (ulong)hVar6 * 4);
    *(int *)(lVar12 + (ulong)hVar6 * 4) = iVar8;
  }
  return iVar8;
}

Assistant:

int Insert(const TBKey& key, const TBValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCodeWithKey<TBKey>(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket], last = -1; i >= 0;)
                {
                    TBKey k = this->GetKey(i);
                    if (this->RemoveIfCollected(k, &i, last, targetBucket))
                    {
                        continue;
                    }

                    if (Comparer<TBKey>::Equals(k, key))
                    {
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            SetValue(value, i);
                            return i;
                        }
                        return -1;
                    }

                    last = i;
                    i = localEntries[i].next;
                }
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (freeCount == 0 && count == size)
            {
                this->Cleanup();
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if (freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            SetKeyValue(key, value, index);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

            return index;
        }